

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclConfig.cpp
# Opt level: O2

Value __thiscall xmrig::OclConfig::toJSON(OclConfig *this,Document *doc)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Document *in_RDX;
  undefined8 extraout_RDX;
  Value VVar1;
  Data local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  StringRefType local_30;
  
  allocator = in_RDX->allocator_;
  this->m_cache = false;
  this->m_enabled = false;
  this->m_shouldSave = false;
  *(undefined5 *)&this->field_0x3 = 0;
  (this->m_devicesHint).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined2 *)
   ((long)&(this->m_devicesHint).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start + 6) = 3;
  local_30.s = "enabled";
  local_30.length = 7;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)this,&local_30,
                  (bool)(doc->
                        super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ).data_.ss.str[1],allocator);
  local_40.s = "cache";
  local_40.length = 5;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)this,&local_40,
                  (bool)(doc->
                        super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ).data_.ss.str[0],allocator);
  local_50.s = "loader";
  local_50.length = 6;
  String::toJSON((String *)&local_70.s);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this,&local_50,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_70.s,allocator);
  local_60.s = "platform";
  local_60.length = 8;
  if ((doc->stack_).stackTop_ == (char *)0x0) {
    local_70._4_1_ = '\0';
    local_70._5_1_ = '\0';
    local_70._6_1_ = '\0';
    local_70._7_1_ = '\0';
    local_70._0_4_ = *(uint *)&doc[1].allocator_;
    local_70.s.str =
         (Ch *)((ulong)(-1 < (int)*(uint *)&doc[1].allocator_) << 0x35 | 0x1d6000000000000);
  }
  else {
    String::toJSON((String *)&local_70.s);
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this,&local_60,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_70.s,allocator);
  Threads<xmrig::OclThreads>::toJSON
            ((Threads<xmrig::OclThreads> *)&(doc->stack_).stackEnd_,(Value *)this,in_RDX);
  VVar1.data_.s.str = (Ch *)extraout_RDX;
  VVar1.data_.n = (Number)this;
  return (Value)VVar1.data_;
}

Assistant:

rapidjson::Value xmrig::OclConfig::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    Value obj(kObjectType);

    obj.AddMember(StringRef(kEnabled),  m_enabled, allocator);
    obj.AddMember(StringRef(kCache),    m_cache, allocator);
    obj.AddMember(StringRef(kLoader),   m_loader.toJSON(), allocator);
    obj.AddMember(StringRef(kPlatform), m_platformVendor.isEmpty() ? Value(m_platformIndex) : m_platformVendor.toJSON(), allocator);

    m_threads.toJSON(obj, doc);

    return obj;
}